

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O2

bool __thiscall version_struct::operator>(version_struct *this,version_struct *v)

{
  if (v->major <= this->major) {
    if (v->major < this->major) {
      return true;
    }
    if (v->minor <= this->minor) {
      if (v->minor < this->minor) {
        return true;
      }
      return v->rev < this->rev;
    }
  }
  return false;
}

Assistant:

bool operator>(version_struct v)
  {
    if (major < v.major)
      return false;
    if (major > v.major)
      return true;
    if (minor < v.minor)
      return false;
    if (minor > v.minor)
      return true;
    if (rev > v.rev)
      return true;
    return false;
  }